

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O2

void __thiscall TinyGC::AttachCurrentThread(TinyGC *this)

{
  ThreadState *this_00;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lck;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->ts_mxt_);
  this_00 = (ThreadState *)operator_new(0x20);
  ThreadState::ThreadState(this_00,false);
  std::
  _Hashtable<std::thread::id,std::pair<std::thread::id_const,TinyGC::ThreadState*>,std::allocator<std::pair<std::thread::id_const,TinyGC::ThreadState*>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<std::thread::id,TinyGC::ThreadState*>>
            ((_Hashtable<std::thread::id,std::pair<std::thread::id_const,TinyGC::ThreadState*>,std::allocator<std::pair<std::thread::id_const,TinyGC::ThreadState*>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->thread_to_stack_);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void TinyGC::AttachCurrentThread() {
  std::unique_lock<std::mutex> lck(ts_mxt_);
  auto thread_state = new ThreadState();
  thread_to_stack_.insert(std::pair<std::thread::id, ThreadState *>(
      thread_state->GetThreadId(), thread_state));
  // LOG("thread id is " << thread_state->GetThreadId());
  // LOG("stack start address " << thread_state->GetStackStartAddr());
  // LOG("stack end address " << thread_state->GetStackEndAddr());
}